

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_as_json_int32(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_t len;
  
  uVar3 = bson_new();
  cVar1 = bson_append_int32(uVar3,"foo",0xffffffffffffffff,0x4d2);
  if (cVar1 == '\0') {
    pcVar4 = "bson_append_int32 (b, \"foo\", -1, 1234)";
    uVar3 = 0x154;
  }
  else {
    pcVar4 = (char *)bson_as_json(uVar3,&len);
    if (len == 0x10) {
      iVar2 = strcmp("{ \"foo\" : 1234 }",pcVar4);
      if (iVar2 == 0) {
        bson_free(pcVar4);
        bson_destroy(uVar3);
        return;
      }
      pcVar4 = "!strcmp (\"{ \\\"foo\\\" : 1234 }\", str)";
      uVar3 = 0x157;
    }
    else {
      pcVar4 = "len == 16";
      uVar3 = 0x156;
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar3,"test_bson_as_json_int32",pcVar4);
  abort();
}

Assistant:

static void
test_bson_as_json_int32 (void)
{
   size_t len;
   bson_t *b;
   char *str;

   b = bson_new ();
   BSON_ASSERT (bson_append_int32 (b, "foo", -1, 1234));
   str = bson_as_json (b, &len);
   BSON_ASSERT (len == 16);
   BSON_ASSERT (!strcmp ("{ \"foo\" : 1234 }", str));
   bson_free (str);
   bson_destroy (b);
}